

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O3

int NGA_Create_ghosts_irreg_config64
              (int type,int ndim,int64_t *dims,int64_t *width,char *name,int64_t *block,int64_t *map
              ,int p_handle)

{
  Integer *pIVar1;
  logical lVar2;
  int iVar3;
  ulong uVar4;
  ulong ndim_00;
  Integer g_a;
  Integer _ga_width [7];
  Integer _ga_work [7];
  Integer _ga_dims [7];
  
  if (7 < ndim) {
    return 0;
  }
  if (0 < ndim) {
    ndim_00 = (ulong)(uint)ndim;
    uVar4 = ndim_00;
    do {
      _ga_dims[uVar4 - 1] = *dims;
      dims = dims + 1;
      uVar4 = uVar4 - 1;
    } while (uVar4 != 0);
    uVar4 = ndim_00;
    pIVar1 = block;
    if (0 < ndim) {
      do {
        _ga_work[uVar4 - 1] = *pIVar1;
        uVar4 = uVar4 - 1;
        pIVar1 = pIVar1 + 1;
      } while (uVar4 != 0);
      uVar4 = ndim_00;
      if (0 < ndim) {
        do {
          _ga_width[uVar4 - 1] = *width;
          width = width + 1;
          uVar4 = uVar4 - 1;
        } while (uVar4 != 0);
        goto LAB_0018cde9;
      }
    }
  }
  ndim_00 = (ulong)ndim;
LAB_0018cde9:
  pIVar1 = copy_map64(block,ndim,map);
  _ga_irreg_flag = 1;
  lVar2 = pnga_create_ghosts_irreg_config
                    ((long)type,ndim_00,_ga_dims,_ga_width,name,pIVar1,_ga_work,(long)p_handle,&g_a)
  ;
  _ga_irreg_flag = 0;
  free(pIVar1);
  iVar3 = 0;
  if (lVar2 == 1) {
    iVar3 = (int)g_a;
  }
  return iVar3;
}

Assistant:

int NGA_Create_ghosts_irreg_config64(int type, int ndim, int64_t dims[], int64_t width[], char *name, int64_t block[], int64_t map[], int p_handle)
{
    Integer g_a;
    logical st;
    Integer _ga_dims[MAXDIM];
    Integer _ga_work[MAXDIM];
    Integer _ga_width[MAXDIM];
    Integer *_ga_map_capi;
    if(ndim>MAXDIM)return 0;

    COPYC2F(dims,_ga_dims, ndim);
    COPYC2F(block,_ga_work, ndim);
    COPYC2F(width,_ga_width, ndim);
    _ga_map_capi = copy_map64(block, ndim, map);

    _ga_irreg_flag = 1; /* set this flag=1, to indicate array is irregular */
    st = wnga_create_ghosts_irreg_config(type, (Integer)ndim, _ga_dims,
					 _ga_width, name, _ga_map_capi, _ga_work, 
					 (Integer)p_handle, &g_a);
    _ga_irreg_flag = 0; /* unset it, after creating array */ 

    free(_ga_map_capi);
    if(st==TRUE) return (int) g_a;
    else return 0;
}